

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCore.c
# Opt level: O1

int Acec_MatchBoxes(Acec_Box_t *pBox0,Acec_Box_t *pBox1)

{
  uint *puVar1;
  uint *puVar2;
  int iVar3;
  Vec_Wec_t *pVVar4;
  Vec_Int_t *pVVar5;
  Vec_Wec_t *pVVar6;
  Vec_Wec_t *pVVar7;
  Vec_Int_t *pVVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  Vec_Int_t *p;
  Gia_Man_t *pTwo;
  Gia_Man_t *pOne;
  Vec_Int_t *p_00;
  uint *puVar16;
  Vec_Int_t *p_01;
  ulong uVar17;
  uint *puVar18;
  long lVar19;
  Vec_Int_t *vMap1;
  Vec_Int_t *vMap0;
  Acec_Box_t *local_58;
  Vec_Int_t *local_50;
  ulong local_48;
  Vec_Int_t *local_40;
  long local_38;
  
  pOne = pBox0->pGia;
  pTwo = pBox1->pGia;
  Acec_ComputeEquivClasses(pOne,pTwo,&vMap0,&vMap1);
  pVVar5 = vMap0;
  pVVar7 = pBox0->vLeafLits;
  if (0 < pVVar7->nSize) {
    lVar13 = 8;
    lVar19 = 0;
    do {
      pOne = *(Gia_Man_t **)((long)&pVVar7->pArray->nCap + lVar13);
      uVar12 = *(uint *)((long)pVVar7->pArray + lVar13 + -4);
      pTwo = (Gia_Man_t *)(ulong)uVar12;
      Acec_MatchBoxesSort((int *)pOne,uVar12,pVVar5->pArray);
      lVar19 = lVar19 + 1;
      pVVar7 = pBox0->vLeafLits;
      lVar13 = lVar13 + 0x10;
    } while (lVar19 < pVVar7->nSize);
  }
  pVVar5 = vMap1;
  pVVar7 = pBox1->vLeafLits;
  if (0 < pVVar7->nSize) {
    lVar13 = 8;
    lVar19 = 0;
    do {
      pOne = *(Gia_Man_t **)((long)&pVVar7->pArray->nCap + lVar13);
      uVar12 = *(uint *)((long)pVVar7->pArray + lVar13 + -4);
      pTwo = (Gia_Man_t *)(ulong)uVar12;
      Acec_MatchBoxesSort((int *)pOne,uVar12,pVVar5->pArray);
      lVar19 = lVar19 + 1;
      pVVar7 = pBox1->vLeafLits;
      lVar13 = lVar13 + 0x10;
    } while (lVar19 < pVVar7->nSize);
  }
  Acec_MatchCheckShift
            (pOne,pTwo,pBox0->vLeafLits,pVVar7,vMap0,vMap1,pBox0->vRootLits,pBox1->vRootLits);
  if (pBox0->vShared != (Vec_Wec_t *)0x0) {
    __assert_fail("pBox0->vShared == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecCore.c"
                  ,0x19e,"int Acec_MatchBoxes(Acec_Box_t *, Acec_Box_t *)");
  }
  if (pBox1->vShared != (Vec_Wec_t *)0x0) {
    __assert_fail("pBox1->vShared == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecCore.c"
                  ,0x19f,"int Acec_MatchBoxes(Acec_Box_t *, Acec_Box_t *)");
  }
  pVVar7 = pBox0->vLeafLits;
  iVar3 = pVVar7->nSize;
  pVVar4 = (Vec_Wec_t *)malloc(0x10);
  iVar9 = iVar3;
  if (iVar3 - 1U < 7) {
    iVar9 = 8;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar9;
  if (iVar9 == 0) {
    pVVar5 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar5 = (Vec_Int_t *)calloc((long)iVar9,0x10);
  }
  pVVar4->pArray = pVVar5;
  pVVar4->nSize = iVar3;
  pBox0->vShared = pVVar4;
  pVVar4 = pBox1->vLeafLits;
  iVar3 = pVVar4->nSize;
  pVVar6 = (Vec_Wec_t *)malloc(0x10);
  iVar9 = 8;
  if (6 < iVar3 - 1U) {
    iVar9 = iVar3;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = iVar9;
  if (iVar9 == 0) {
    pVVar5 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar5 = (Vec_Int_t *)calloc((long)iVar9,0x10);
  }
  pVVar6->pArray = pVVar5;
  pVVar6->nSize = iVar3;
  pBox1->vShared = pVVar6;
  iVar3 = pVVar7->nSize;
  pVVar6 = (Vec_Wec_t *)malloc(0x10);
  iVar9 = iVar3;
  if (iVar3 - 1U < 7) {
    iVar9 = 8;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = iVar9;
  if (iVar9 == 0) {
    pVVar5 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar5 = (Vec_Int_t *)calloc((long)iVar9,0x10);
  }
  pVVar6->pArray = pVVar5;
  pVVar6->nSize = iVar3;
  pBox0->vUnique = pVVar6;
  iVar3 = pVVar4->nSize;
  pVVar6 = (Vec_Wec_t *)malloc(0x10);
  iVar9 = 8;
  if (6 < iVar3 - 1U) {
    iVar9 = iVar3;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = iVar9;
  if (iVar9 == 0) {
    pVVar5 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar5 = (Vec_Int_t *)calloc((long)iVar9,0x10);
  }
  pVVar6->pArray = pVVar5;
  pVVar6->nSize = iVar3;
  pBox1->vUnique = pVVar6;
  uVar12 = pVVar4->nSize;
  if (pVVar7->nSize < pVVar4->nSize) {
    uVar12 = pVVar7->nSize;
  }
  uVar15 = (ulong)uVar12;
  pVVar7 = pBox0->vLeafLits;
  uVar17 = uVar15;
  if ((int)uVar12 < pVVar7->nSize) {
    do {
      if (((int)uVar12 < 0) || (pBox0->vUnique->nSize <= (int)uVar17)) goto LAB_00661c84;
      pVVar5 = pVVar7->pArray;
      if (0 < pVVar5[uVar17].nSize) {
        pVVar8 = pBox0->vUnique->pArray;
        lVar13 = 0;
        do {
          Vec_IntPush(pVVar8 + uVar17,pVVar5[uVar17].pArray[lVar13]);
          lVar13 = lVar13 + 1;
        } while (lVar13 < pVVar5[uVar17].nSize);
      }
      uVar17 = uVar17 + 1;
      pVVar7 = pBox0->vLeafLits;
    } while ((int)uVar17 < pVVar7->nSize);
  }
  pVVar7 = pBox1->vLeafLits;
  uVar17 = uVar15;
  if ((int)uVar12 < pVVar7->nSize) {
    do {
      if (((int)uVar12 < 0) || (pBox1->vUnique->nSize <= (int)uVar17)) goto LAB_00661c84;
      pVVar5 = pVVar7->pArray;
      if (0 < pVVar5[uVar17].nSize) {
        pVVar8 = pBox1->vUnique->pArray;
        lVar13 = 0;
        do {
          Vec_IntPush(pVVar8 + uVar17,pVVar5[uVar17].pArray[lVar13]);
          lVar13 = lVar13 + 1;
        } while (lVar13 < pVVar5[uVar17].nSize);
      }
      uVar17 = uVar17 + 1;
      pVVar7 = pBox1->vLeafLits;
    } while ((int)uVar17 < pVVar7->nSize);
  }
  if (0 < (int)uVar12) {
    uVar17 = 0;
    local_58 = pBox1;
    do {
      if ((((((long)pBox0->vShared->nSize <= (long)uVar17) ||
            ((long)local_58->vShared->nSize <= (long)uVar17)) ||
           ((long)pBox0->vUnique->nSize <= (long)uVar17)) ||
          (((long)local_58->vUnique->nSize <= (long)uVar17 ||
           ((long)pBox0->vLeafLits->nSize <= (long)uVar17)))) ||
         ((long)local_58->vLeafLits->nSize <= (long)uVar17)) {
LAB_00661c84:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      local_38 = uVar17 * 0x10;
      pVVar5 = pBox0->vShared->pArray + uVar17;
      pVVar8 = local_58->vShared->pArray + uVar17;
      p = pBox0->vUnique->pArray + uVar17;
      p_01 = local_58->vUnique->pArray + uVar17;
      local_40 = pBox0->vLeafLits->pArray;
      local_50 = local_58->vLeafLits->pArray;
      puVar18 = (uint *)local_40[uVar17].pArray;
      puVar16 = (uint *)local_50[uVar17].pArray;
      puVar1 = puVar18 + local_40[uVar17].nSize;
      puVar2 = puVar16 + local_50[uVar17].nSize;
      local_48 = uVar17;
      if ((0 < (long)local_40[uVar17].nSize) && (0 < local_50[uVar17].nSize)) {
        do {
          uVar12 = *puVar18;
          if ((int)uVar12 < 0) {
LAB_00661c27:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x135,"int Abc_Lit2LitL(int *, int)");
          }
          if (vMap0->pArray[uVar12 >> 1] < 0) {
LAB_00661c46:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          uVar14 = *puVar16;
          if ((int)uVar14 < 0) goto LAB_00661c27;
          if (vMap1->pArray[uVar14 >> 1] < 0) goto LAB_00661c46;
          if ((uVar12 == 0) || (uVar14 == 0)) {
            __assert_fail("*pBeg0 && *pBeg1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecCore.c"
                          ,0x1ba,"int Acec_MatchBoxes(Acec_Box_t *, Acec_Box_t *)");
          }
          uVar10 = vMap0->pArray[uVar12 >> 1] ^ uVar12 & 1;
          uVar11 = vMap1->pArray[uVar14 >> 1] ^ uVar14 & 1;
          if (uVar10 == uVar11) {
            puVar18 = puVar18 + 1;
            Vec_IntPush(pVVar5,uVar12);
            uVar14 = *puVar16;
            puVar16 = puVar16 + 1;
            p_00 = pVVar8;
          }
          else if (uVar11 < uVar10) {
            puVar18 = puVar18 + 1;
            p_00 = p;
            uVar14 = uVar12;
          }
          else {
            puVar16 = puVar16 + 1;
            p_00 = p_01;
          }
          Vec_IntPush(p_00,uVar14);
        } while ((puVar18 < puVar1) && (puVar16 < puVar2));
      }
      for (; puVar18 < puVar1; puVar18 = puVar18 + 1) {
        Vec_IntPush(p,*puVar18);
      }
      for (; puVar16 < puVar2; puVar16 = puVar16 + 1) {
        Vec_IntPush(p_01,*puVar16);
      }
      iVar3 = pVVar5->nSize;
      iVar9 = pVVar8->nSize;
      if (iVar3 != iVar9) {
        __assert_fail("Vec_IntSize(vShared0) == Vec_IntSize(vShared1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecCore.c"
                      ,0x1c9,"int Acec_MatchBoxes(Acec_Box_t *, Acec_Box_t *)");
      }
      if (iVar3 + p->nSize != *(int *)((long)&local_40->nSize + local_38)) {
        __assert_fail("Vec_IntSize(vShared0) + Vec_IntSize(vUnique0) == Vec_IntSize(vLevel0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecCore.c"
                      ,0x1ca,"int Acec_MatchBoxes(Acec_Box_t *, Acec_Box_t *)");
      }
      if (iVar9 + p_01->nSize != *(int *)((long)&local_50->nSize + local_38)) {
        __assert_fail("Vec_IntSize(vShared1) + Vec_IntSize(vUnique1) == Vec_IntSize(vLevel1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecCore.c"
                      ,0x1cb,"int Acec_MatchBoxes(Acec_Box_t *, Acec_Box_t *)");
      }
      uVar17 = local_48 + 1;
      pBox1 = local_58;
    } while (uVar17 != uVar15);
  }
  lVar13 = (long)pBox0->vShared->nSize;
  uVar17 = 0;
  uVar12 = 0;
  if (0 < lVar13) {
    lVar19 = 0;
    uVar12 = 0;
    do {
      uVar12 = uVar12 + *(int *)((long)&pBox0->vShared->pArray->nSize + lVar19);
      lVar19 = lVar19 + 0x10;
    } while (lVar13 * 0x10 != lVar19);
  }
  lVar13 = (long)pBox0->vLeafLits->nSize;
  if (0 < lVar13) {
    lVar19 = 0;
    uVar17 = 0;
    do {
      uVar17 = (ulong)(uint)((int)uVar17 + *(int *)((long)&pBox0->vLeafLits->pArray->nSize + lVar19)
                            );
      lVar19 = lVar19 + 0x10;
    } while (lVar13 * 0x10 != lVar19);
  }
  uVar14 = 0;
  printf("Box0: Matched %d entries out of %d.\n",(ulong)uVar12,uVar17);
  lVar13 = (long)pBox1->vLeafLits->nSize;
  if (0 < lVar13) {
    lVar19 = 0;
    uVar14 = 0;
    do {
      uVar14 = uVar14 + *(int *)((long)&pBox1->vLeafLits->pArray->nSize + lVar19);
      lVar19 = lVar19 + 0x10;
    } while (lVar13 * 0x10 != lVar19);
  }
  printf("Box1: Matched %d entries out of %d.\n",(ulong)uVar12,(ulong)uVar14);
  if (vMap0->pArray != (int *)0x0) {
    free(vMap0->pArray);
    vMap0->pArray = (int *)0x0;
  }
  if (vMap0 != (Vec_Int_t *)0x0) {
    free(vMap0);
  }
  if (vMap1->pArray != (int *)0x0) {
    free(vMap1->pArray);
    vMap1->pArray = (int *)0x0;
  }
  if (vMap1 != (Vec_Int_t *)0x0) {
    free(vMap1);
  }
  return uVar12;
}

Assistant:

int Acec_MatchBoxes( Acec_Box_t * pBox0, Acec_Box_t * pBox1 )
{
    Vec_Int_t * vMap0, * vMap1, * vLevel; 
    int i, nSize, nTotal;
    Acec_ComputeEquivClasses( pBox0->pGia, pBox1->pGia, &vMap0, &vMap1 );
    // sort nodes in the classes by their equivalences
    Vec_WecForEachLevel( pBox0->vLeafLits, vLevel, i )
        Acec_MatchBoxesSort( Vec_IntArray(vLevel), Vec_IntSize(vLevel), Vec_IntArray(vMap0) );
    Vec_WecForEachLevel( pBox1->vLeafLits, vLevel, i )
        Acec_MatchBoxesSort( Vec_IntArray(vLevel), Vec_IntSize(vLevel), Vec_IntArray(vMap1) );
    Acec_MatchCheckShift( pBox0->pGia, pBox1->pGia, pBox0->vLeafLits, pBox1->vLeafLits, vMap0, vMap1, pBox0->vRootLits, pBox1->vRootLits );
    
    //Acec_MatchPrintEquivLits( pBox0->pGia, pBox0->vLeafLits, Vec_IntArray(vMap0), 0 );
    //Acec_MatchPrintEquivLits( pBox1->pGia, pBox1->vLeafLits, Vec_IntArray(vMap1), 0 );
    //printf( "Outputs:\n" );
    //Vec_WecPrintLits( pBox0->vRootLits );
    //printf( "Outputs:\n" );
    //Vec_WecPrintLits( pBox1->vRootLits );

    // reorder nodes to have the same order
    assert( pBox0->vShared == NULL );
    assert( pBox1->vShared == NULL );
    pBox0->vShared = Vec_WecStart( Vec_WecSize(pBox0->vLeafLits) );
    pBox1->vShared = Vec_WecStart( Vec_WecSize(pBox1->vLeafLits) );
    pBox0->vUnique = Vec_WecStart( Vec_WecSize(pBox0->vLeafLits) );
    pBox1->vUnique = Vec_WecStart( Vec_WecSize(pBox1->vLeafLits) );
    nSize = Abc_MinInt( Vec_WecSize(pBox0->vLeafLits), Vec_WecSize(pBox1->vLeafLits) );
    Vec_WecForEachLevelStart( pBox0->vLeafLits, vLevel, i, nSize )
        Vec_IntAppend( Vec_WecEntry(pBox0->vUnique, i), vLevel );
    Vec_WecForEachLevelStart( pBox1->vLeafLits, vLevel, i, nSize )
        Vec_IntAppend( Vec_WecEntry(pBox1->vUnique, i), vLevel );
    for ( i = 0; i < nSize; i++ )
    {
        Vec_Int_t * vShared0 = Vec_WecEntry( pBox0->vShared, i );
        Vec_Int_t * vShared1 = Vec_WecEntry( pBox1->vShared, i );
        Vec_Int_t * vUnique0 = Vec_WecEntry( pBox0->vUnique, i );
        Vec_Int_t * vUnique1 = Vec_WecEntry( pBox1->vUnique, i );

        Vec_Int_t * vLevel0 = Vec_WecEntry( pBox0->vLeafLits, i );
        Vec_Int_t * vLevel1 = Vec_WecEntry( pBox1->vLeafLits, i );
        int * pBeg0 = Vec_IntArray(vLevel0);
        int * pBeg1 = Vec_IntArray(vLevel1);
        int * pEnd0 = Vec_IntLimit(vLevel0);
        int * pEnd1 = Vec_IntLimit(vLevel1);
        while ( pBeg0 < pEnd0 && pBeg1 < pEnd1 )
        {
            int Entry0 = Abc_Lit2LitL( Vec_IntArray(vMap0), *pBeg0 );
            int Entry1 = Abc_Lit2LitL( Vec_IntArray(vMap1), *pBeg1 );
            assert( *pBeg0 && *pBeg1 );
            if ( Entry0 == Entry1 )
            {
                Vec_IntPush( vShared0, *pBeg0++ );
                Vec_IntPush( vShared1, *pBeg1++ );
            }
            else if ( Entry0 > Entry1 )
                Vec_IntPush( vUnique0, *pBeg0++ );
            else 
                Vec_IntPush( vUnique1, *pBeg1++ );
        }
        while ( pBeg0 < pEnd0 )
            Vec_IntPush( vUnique0, *pBeg0++ );
        while ( pBeg1 < pEnd1 )
            Vec_IntPush( vUnique1, *pBeg1++ );
        assert( Vec_IntSize(vShared0) == Vec_IntSize(vShared1) );
        assert( Vec_IntSize(vShared0) + Vec_IntSize(vUnique0) == Vec_IntSize(vLevel0) );
        assert( Vec_IntSize(vShared1) + Vec_IntSize(vUnique1) == Vec_IntSize(vLevel1) );
    }
    nTotal = Vec_WecSizeSize(pBox0->vShared);
    printf( "Box0: Matched %d entries out of %d.\n", nTotal, Vec_WecSizeSize(pBox0->vLeafLits) );
    printf( "Box1: Matched %d entries out of %d.\n", nTotal, Vec_WecSizeSize(pBox1->vLeafLits) );

    //Acec_MatchPrintEquivLits( pBox0->pGia, pBox0->vShared, Vec_IntArray(vMap0), 0 );
    //Acec_MatchPrintEquivLits( pBox1->pGia, pBox1->vShared, Vec_IntArray(vMap1), 0 );
    //printf( "\n" );

    //Acec_MatchPrintEquivLits( pBox0->pGia, pBox0->vUnique, Vec_IntArray(vMap0), 0 );
    //Acec_MatchPrintEquivLits( pBox1->pGia, pBox1->vUnique, Vec_IntArray(vMap1), 0 );

    Vec_IntFree( vMap0 );
    Vec_IntFree( vMap1 );
    return nTotal;
}